

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_292481::PulsePlayback::open(PulsePlayback *this,char *__file,int __oflag,...)

{
  PulseMainloop *this_00;
  ALCdevice *pAVar1;
  code *pcVar2;
  int iVar3;
  ALuint AVar4;
  int extraout_EAX;
  int iVar5;
  pa_context *ppVar6;
  pa_stream *ppVar7;
  undefined8 uVar8;
  pa_operation *op;
  backend_exception *this_01;
  long lVar9;
  int __oflag_00;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  pa_sample_spec spec;
  unique_lock<std::mutex> plock;
  al local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  if (__file == (char *)0x0) {
    pcVar10 = (char *)0x0;
    uVar8 = (pointer)0x0;
    goto LAB_00169ed7;
  }
  if ((anonymous_namespace)::PlaybackDevices == DAT_0022f5b8) {
    PulseMainloop::probePlaybackDevices(&this->mMainloop);
  }
  pcVar10 = DAT_0022f5b8;
  lVar9 = (long)DAT_0022f5b8 - (long)(anonymous_namespace)::PlaybackDevices >> 8;
  pcVar11 = (anonymous_namespace)::PlaybackDevices;
  if (0 < lVar9) {
    lVar9 = lVar9 + 1;
    do {
      iVar3 = std::__cxx11::string::compare(pcVar11);
      pcVar12 = pcVar11;
      if (iVar3 == 0) goto LAB_00169ec1;
      iVar3 = std::__cxx11::string::compare(pcVar11 + 0x40);
      pcVar12 = pcVar11 + 0x40;
      if (iVar3 == 0) goto LAB_00169ec1;
      iVar3 = std::__cxx11::string::compare(pcVar11 + 0x80);
      pcVar12 = pcVar11 + 0x80;
      if (iVar3 == 0) goto LAB_00169ec1;
      iVar3 = std::__cxx11::string::compare(pcVar11 + 0xc0);
      pcVar12 = pcVar11 + 0xc0;
      if (iVar3 == 0) goto LAB_00169ec1;
      pcVar11 = pcVar11 + 0x100;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)pcVar10 - (long)pcVar11 >> 6;
  if (lVar9 == 1) {
LAB_00169ea0:
    iVar3 = std::__cxx11::string::compare(pcVar11);
    pcVar12 = pcVar10;
    if (iVar3 == 0) {
      pcVar12 = pcVar11;
    }
  }
  else {
    pcVar12 = pcVar11;
    if (lVar9 == 2) {
LAB_00169e8d:
      iVar3 = std::__cxx11::string::compare(pcVar12);
      if (iVar3 != 0) {
        pcVar11 = pcVar12 + 0x40;
        goto LAB_00169ea0;
      }
    }
    else {
      pcVar12 = pcVar10;
      if ((lVar9 == 3) &&
         (iVar3 = std::__cxx11::string::compare(pcVar11), pcVar12 = pcVar11, iVar3 != 0)) {
        pcVar12 = pcVar11 + 0x40;
        goto LAB_00169e8d;
      }
    }
  }
LAB_00169ec1:
  if (pcVar12 == DAT_0022f5b8) {
    this_01 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(this_01,0xa004,"Device name \"%s\" not found",__file);
    __cxa_throw(this_01,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
  }
  pcVar10 = *(char **)pcVar12;
  uVar8 = *(undefined8 *)(pcVar12 + 0x20);
LAB_00169ed7:
  this_00 = &this->mMainloop;
  plock._M_device = &(this->mMainloop).mMutex;
  plock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&plock);
  plock._M_owns = true;
  ppVar6 = PulseMainloop::connectContext(this_00,&plock);
  this->mContext = ppVar6;
  __oflag_00 = 0x1766ca;
  iVar3 = GetConfigValueBool((char *)0x0,"pulse","allow-moves",1);
  spec.format = PA_SAMPLE_S16LE;
  spec.rate = 0xac44;
  spec.channels = '\x02';
  spec._9_3_ = 0;
  if ((pointer)uVar8 == (pointer)0x0) {
    if (((anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_ == '\0') &&
       (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::PulsePlayback::open(char_const*)::
                                     defname_abi_cxx11_), iVar5 != 0)) {
      al::getenv_abi_cxx11_(local_58,"ALSOFT_PULSE_DEFAULT");
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.mHasValue = false;
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue.
      _M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue.
      _M_string_length = 0;
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._16_8_ = 0
      ;
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._24_8_ = 0
      ;
      if (local_58[0] == (al)0x1) {
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue.
        _M_dataplus._M_p =
             (_Alloc_hider)
             ((long)&(anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.
                     field_1 + 0x10);
        if (local_50._M_p == &local_40) {
          (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._24_8_
               = uStack_38;
        }
        else {
          (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue
          ._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_50._M_p;
        }
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._17_7_ =
             uStack_3f;
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mDummy
        [0x10] = local_40;
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue.
        _M_string_length = local_48;
        local_48 = 0;
        local_40 = '\0';
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.mHasValue = true
        ;
        local_50._M_p = &local_40;
      }
      __oflag_00 = 0x22f848;
      __cxa_atexit(al::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~optional,
                   &(anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::PulsePlayback::open(char_const*)::
                           defname_abi_cxx11_);
    }
    uVar8 = (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.
            mValue._M_dataplus._M_p;
    if ((anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.mHasValue ==
        false) {
      uVar8 = (pointer)0x0;
    }
  }
  if (2 < (int)gLogLevel) {
    _GLOBAL__N_1::PulsePlayback::open((char *)uVar8,__oflag_00);
  }
  ppVar7 = PulseMainloop::connectStream
                     (this_00,(char *)uVar8,&plock,this->mContext,
                      (uint)(iVar3 == 0) << 9 |
                      (PA_STREAM_FIX_CHANNELS|PA_STREAM_FIX_RATE|PA_STREAM_FIX_FORMAT|
                      PA_STREAM_START_CORKED),(pa_buffer_attr *)0x0,&spec,(pa_channel_map *)0x0,
                      Playback);
  this->mStream = ppVar7;
  (*(anonymous_namespace)::ppa_stream_set_moved_callback)(ppVar7,streamMovedCallbackC,this);
  pcVar2 = (anonymous_namespace)::ppa_frame_size;
  uVar8 = (*(anonymous_namespace)::ppa_stream_get_sample_spec)(this->mStream);
  AVar4 = (*pcVar2)(uVar8);
  this->mFrameSize = AVar4;
  pcVar12 = (char *)(*(anonymous_namespace)::ppa_stream_get_device_name)(this->mStream);
  pcVar11 = (char *)(this->mDeviceName)._M_string_length;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)&this->mDeviceName,0,pcVar11,(ulong)pcVar12);
  if (pcVar10 == (char *)0x0) {
    op = (pa_operation *)
         (*(anonymous_namespace)::ppa_context_get_sink_info_by_name)
                   (this->mContext,(this->mDeviceName)._M_dataplus._M_p,sinkNameCallbackC,this);
    PulseMainloop::waitForOperation(this_00,op,&plock);
  }
  else {
    pAVar1 = (this->super_BackendBase).mDevice;
    pcVar11 = (char *)(pAVar1->DeviceName)._M_string_length;
    strlen(pcVar10);
    std::__cxx11::string::_M_replace((ulong)&pAVar1->DeviceName,0,pcVar11,(ulong)pcVar10);
  }
  std::unique_lock<std::mutex>::~unique_lock(&plock);
  return extraout_EAX;
}

Assistant:

void PulsePlayback::open(const ALCchar *name)
{
    const char *pulse_name{nullptr};
    const char *dev_name{nullptr};

    if(name)
    {
        if(PlaybackDevices.empty())
            mMainloop.probePlaybackDevices();

        auto iter = std::find_if(PlaybackDevices.cbegin(), PlaybackDevices.cend(),
            [name](const DevMap &entry) -> bool { return entry.name == name; });
        if(iter == PlaybackDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        pulse_name = iter->device_name.c_str();
        dev_name = iter->name.c_str();
    }

    auto plock = mMainloop.getUniqueLock();
    mContext = mMainloop.connectContext(plock);

    pa_stream_flags_t flags{PA_STREAM_START_CORKED | PA_STREAM_FIX_FORMAT | PA_STREAM_FIX_RATE |
        PA_STREAM_FIX_CHANNELS};
    if(!GetConfigValueBool(nullptr, "pulse", "allow-moves", 1))
        flags |= PA_STREAM_DONT_MOVE;

    pa_sample_spec spec{};
    spec.format = PA_SAMPLE_S16NE;
    spec.rate = 44100;
    spec.channels = 2;

    if(!pulse_name)
    {
        static const auto defname = al::getenv("ALSOFT_PULSE_DEFAULT");
        if(defname) pulse_name = defname->c_str();
    }
    TRACE("Connecting to \"%s\"\n", pulse_name ? pulse_name : "(default)");
    mStream = mMainloop.connectStream(pulse_name, plock, mContext, flags, nullptr, &spec, nullptr,
        BackendType::Playback);

    pa_stream_set_moved_callback(mStream, &PulsePlayback::streamMovedCallbackC, this);
    mFrameSize = static_cast<ALuint>(pa_frame_size(pa_stream_get_sample_spec(mStream)));

    mDeviceName = pa_stream_get_device_name(mStream);
    if(!dev_name)
    {
        pa_operation *op{pa_context_get_sink_info_by_name(mContext, mDeviceName.c_str(),
            &PulsePlayback::sinkNameCallbackC, this)};
        mMainloop.waitForOperation(op, plock);
    }
    else
        mDevice->DeviceName = dev_name;
}